

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O2

int compArgStr(char *str,char *arg,int min)

{
  int iVar1;
  __int32_t _Var2;
  size_t sVar3;
  __int32_t **pp_Var4;
  ushort **ppuVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (arg == (char *)0x0 || str == (char *)0x0) {
LAB_001268bd:
    uVar8 = 0;
  }
  else {
    sVar3 = strlen(arg);
    uVar7 = 0;
    uVar8 = sVar3 & 0xffffffff;
    if ((int)sVar3 < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pp_Var4 = __ctype_toupper_loc();
      iVar1 = (*pp_Var4)[str[uVar7]];
      _Var2 = (*pp_Var4)[arg[uVar7]];
      if (((long)min <= (long)uVar7) &&
         ((((iVar6 = iVar1 << 0x18, iVar6 == 0 || (iVar6 == 0x2b000000)) || (iVar6 == 0x2d000000))
          || ((iVar6 == 0x2e000000 ||
              (ppuVar5 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar5 + (long)(iVar6 >> 0x18) * 2 + 1) & 8) != 0)))))) {
        uVar8 = uVar7 & 0xffffffff;
        break;
      }
      if ((char)_Var2 != (char)iVar1) goto LAB_001268bd;
    }
  }
  return (int)uVar8;
}

Assistant:

int compArgStr(char *str, char *arg, int min) {
   int i, max;
   char s, a;

   if (!str || !arg) return 0;

   max = strlen(arg);

   for(i=0; i<max; i++) {
      s = toupper(str[i]);
      a = toupper(arg[i]);

      if (i >= min && (s == '\0' || s == '.'
	 || s == '+' || s == '-' || isdigit(s))) {
	 break; /* good ending point */
      }
      else if (s != a) {
	 i = 0; /* failed to match */
	 break;
      }
   }

   return i;
}